

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_buffer_load_instruction(Impl *impl,CallInst *instruction)

{
  int iVar1;
  int iVar2;
  StorageClass storage;
  int iVar3;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  undefined8 uVar4;
  Builder *pBVar5;
  CallInst *pCVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Id IVar10;
  uint uVar11;
  RawWidth width_00;
  TypeID TVar12;
  uint size;
  Value *pVVar13;
  void *pvVar14;
  Type *pTVar15;
  Type *element_type_00;
  Type *data_type;
  BufferAccessInfo BVar16;
  LoggingCallback p_Var17;
  Operation *pOVar18;
  Id local_22b4;
  undefined1 local_22a2;
  undefined1 local_22a1;
  uint local_2288;
  byte local_2272;
  byte local_2271;
  Id local_225c;
  Id local_2228;
  RawType local_2224;
  initializer_list<unsigned_int> local_2220;
  Operation *local_2210;
  Operation *op_2;
  Op opcode_1;
  Id local_21fc;
  Op *local_21f8;
  undefined8 local_21f0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_21e8;
  Id local_21cc;
  Id local_21c8;
  Id sample_type;
  Id texel_type;
  ComponentType effective_component_type;
  bool is_uav_1;
  Operation *op_1;
  Operation *narrow_op_1;
  Operation *narrow_op;
  Operation *bitcast_op_1;
  uint local_2198;
  Id casted_id;
  uint i_5;
  uint i_4;
  Operation *bitcast_op;
  Operation *pOStack_2180;
  uint i_3;
  Operation *op;
  Operation *extracted_op_1;
  Operation *extracted_op;
  Operation *code_extract_op;
  initializer_list<unsigned_int> local_2158;
  Operation *local_2148;
  Operation *loaded_op;
  uint local_2138;
  Op opcode;
  uint i_2;
  bool first_load;
  Id IStack_212c;
  iterator local_2128;
  undefined8 local_2120;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_2118;
  Id local_2100;
  Id local_20fc;
  Id sparse_loaded_id_type;
  Id sparse_code_id;
  Id loaded_id_type;
  bool is_uav;
  Operation *load_op;
  Operation *chain_op;
  uint i_1;
  Id ptr_type;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  bool need_cast;
  Type *element_type;
  Id local_10b0;
  Id IStack_10ac;
  bool ssbo;
  Id constructed_id;
  Id extracted_id_type;
  Id component_ids [4];
  uint i;
  uint vecsize;
  uint conservative_num_elements;
  bool vectorized_load;
  RawType raw_type;
  RawWidth width;
  BufferAccessInfo access;
  bool is_typed;
  Type *target_type;
  Type *result_type;
  char local_1058 [7];
  bool raw_access_chain;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint32_t smeared_access_mask;
  bool sparse;
  mapped_type *local_40;
  mapped_type *access_meta;
  mapped_type *meta;
  Id image_type_id;
  Id image_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  if (((impl->ags).num_instructions == 1) &&
     (pVVar13 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar6 = instruction_local,
     pVVar13 ==
     (Value *)instruction_local[8].super_Instruction.operands.
              super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_finish)) {
    pVVar13 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    IVar10 = Converter::Impl::get_id_for_value((Impl *)pCVar6,pVVar13,0);
    *(Id *)((long)&instruction_local[6].super_Instruction.super_Value.tween_id + 4) = IVar10;
    *(undefined4 *)&instruction_local[6].super_Instruction.is_terminator = 0x44;
    instruction_local[9].super_Instruction.attachments._M_h._M_single_bucket =
         (__node_base_ptr)builder;
    impl_local._7_1_ = true;
  }
  else {
    bVar7 = Converter::Impl::composite_is_accessed((Impl *)instruction_local,(Value *)builder);
    if (bVar7) {
      _image_type_id = Converter::Impl::builder((Impl *)instruction_local);
      pCVar6 = instruction_local;
      pVVar13 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
      meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar6,pVVar13,0);
      meta._0_4_ = Converter::Impl::get_type_id((Impl *)instruction_local,meta._4_4_);
      access_meta = (mapped_type *)
                    std::
                    unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                    ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                  *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                     _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
      _smeared_access_mask = builder;
      local_40 = std::
                 unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                 ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                               *)&instruction_local[10].super_Instruction.attachments._M_h.
                                  _M_before_begin,(key_type *)&smeared_access_mask);
      bVar7 = (local_40->access_mask & 0x10) != 0;
      iVar1._0_1_ = access_meta[3].forced_composite;
      iVar1._1_1_ = access_meta[3].forced_struct;
      iVar1._2_2_ = *(undefined2 *)&access_meta[3].field_0xa;
      if (iVar1 == 0) {
        cb._0_4_ = 1;
      }
      else {
        uVar11 = local_40->access_mask & 0xf;
        uVar11 = uVar11 >> 1 | uVar11;
        cb._0_4_ = uVar11 >> 2 | uVar11;
      }
      iVar2._0_1_ = access_meta[3].forced_composite;
      iVar2._1_1_ = access_meta[3].forced_struct;
      iVar2._2_2_ = *(undefined2 *)&access_meta[3].field_0xa;
      if (iVar2 == 0x14e5) {
        if (bVar7) {
          buffer._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Cannot use BDA and sparse feedback. >:(\n");
            fflush(_stderr);
          }
          else {
            snprintf(local_1058,0x1000,"Cannot use BDA and sparse feedback. >:(\n");
            uVar4 = buffer._4088_8_;
            pvVar14 = get_thread_log_callback_userdata();
            (*(code *)uVar4)(pvVar14,2,local_1058);
          }
          impl_local._7_1_ = false;
        }
        else {
          impl_local._7_1_ =
               emit_physical_buffer_load_instruction
                         ((Impl *)instruction_local,(CallInst *)builder,
                          (PhysicalPointerMeta *)&access_meta[4].components,(uint)cb,4);
        }
      }
      else {
        emit_buffer_synchronization_validation((Impl *)instruction_local,(CallInst *)builder,Load);
        bVar8 = buffer_access_is_raw_access_chain
                          ((Impl *)instruction_local,(ResourceMeta *)access_meta);
        if (bVar8 && !bVar7) {
          impl_local._7_1_ =
               emit_buffer_load_raw_chain_instruction
                         ((Impl *)instruction_local,(CallInst *)builder,(ResourceMeta *)access_meta,
                          local_40);
        }
        else {
          pTVar15 = LLVMBC::Value::getType((Value *)builder);
          element_type_00 = LLVMBC::Type::getStructElementType(pTVar15,0);
          pCVar6 = instruction_local;
          pBVar5 = builder;
          uVar11 = access_meta->access_mask;
          IVar10 = access_meta[5].components;
          data_type = LLVMBC::Type::getStructElementType(pTVar15,0);
          BVar16 = build_buffer_access((Impl *)pCVar6,(CallInst *)pBVar5,0,IVar10,data_type,(uint)cb
                                      );
          storage._0_1_ = access_meta[3].forced_composite;
          storage._1_1_ = access_meta[3].forced_struct;
          storage._2_2_ = *(undefined2 *)&access_meta[3].field_0xa;
          width_00 = get_buffer_access_bits_per_component
                               ((Impl *)instruction_local,storage,element_type_00);
          TVar12 = LLVMBC::Type::getTypeID(element_type_00);
          width = BVar16.raw_vec_size;
          meta._4_4_ = get_buffer_alias_handle
                                 ((Impl *)instruction_local,(ResourceMeta *)access_meta,meta._4_4_,
                                  (uint)(TVar12 == DoubleTyID),width_00,width);
          bVar8 = width != B8;
          if (bVar7) {
            spv::Builder::addCapability(_image_type_id,CapabilitySparseResidency);
          }
          raw_type = BVar16.index_id;
          if ((char)uVar11 == '\n') {
            sample_type._3_1_ = spv::Builder::isStorageImageType(_image_type_id,(Id)meta);
            sample_type._2_1_ =
                 Converter::Impl::get_effective_typed_resource_type
                           (*(ComponentType *)((long)&access_meta->access_mask + 1));
            local_21cc = Converter::Impl::get_type_id
                                   ((Impl *)instruction_local,sample_type._2_1_,1,4,false);
            pCVar6 = instruction_local;
            local_21c8 = local_21cc;
            if (bVar7) {
              opcode_1 = spv::Builder::makeUintType(_image_type_id,0x20);
              local_21fc = local_21c8;
              local_21f8 = &opcode_1;
              local_21f0 = 2;
              __l._M_len = 2;
              __l._M_array = local_21f8;
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                        (&local_21e8,__l,(allocator_type *)((long)&op_2 + 7));
              local_21cc = Converter::Impl::get_struct_type
                                     ((Impl *)pCVar6,&local_21e8,0,"SparseTexel");
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                        (&local_21e8);
            }
            if ((sample_type._3_1_ & 1) == 0) {
              op_2._0_4_ = OpImageFetch;
              if (bVar7) {
                op_2._0_4_ = OpImageSparseFetch;
              }
            }
            else {
              op_2._0_4_ = OpImageRead;
              if (bVar7) {
                op_2._0_4_ = OpImageSparseRead;
              }
            }
            local_2210 = Converter::Impl::allocate
                                   ((Impl *)instruction_local,(Op)op_2,(Value *)builder,local_21cc);
            pCVar6 = instruction_local;
            if (!bVar7) {
              pTVar15 = LLVMBC::Value::getType((Value *)builder);
              pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
              Converter::Impl::decorate_relaxed_precision
                        ((Impl *)pCVar6,pTVar15,local_2210->id,true);
            }
            local_2228 = meta._4_4_;
            local_2224 = raw_type;
            local_2220._M_array = &local_2228;
            local_2220._M_len = 2;
            Operation::add_ids(local_2210,&local_2220);
            Converter::Impl::add
                      ((Impl *)instruction_local,local_2210,
                       (bool)(*(byte *)((long)&access_meta[3].components + 3) & 1));
            if (bVar7) {
              Converter::Impl::repack_sparse_feedback
                        ((Impl *)instruction_local,
                         *(ComponentType *)((long)&access_meta->access_mask + 1),4,(Value *)builder,
                         element_type_00,0);
            }
            else {
              Converter::Impl::fixup_load_type_typed
                        ((Impl *)instruction_local,
                         *(ComponentType *)((long)&access_meta->access_mask + 1),4,(Value *)builder,
                         element_type_00);
              build_exploded_composite_from_vector
                        ((Impl *)instruction_local,(Instruction *)builder,4);
            }
          }
          else {
            i = 0;
            size = raw_vecsize_to_vecsize(width);
            uVar11 = size;
            if (!bVar8) {
              for (component_ids[3] = 0; uVar11 = i, component_ids[3] < 4;
                  component_ids[3] = component_ids[3] + 1) {
                if ((local_40->access_mask & 1 << ((byte)component_ids[3] & 0x1f)) != 0) {
                  i = component_ids[3] + 1;
                }
              }
            }
            i = uVar11;
            memset(&constructed_id,0,0x10);
            pBVar5 = _image_type_id;
            if ((TVar12 == DoubleTyID) == Integer) {
              uVar11 = raw_width_to_bits(width_00);
              local_225c = spv::Builder::makeUintType(pBVar5,uVar11);
            }
            else {
              uVar11 = raw_width_to_bits(width_00);
              local_225c = spv::Builder::makeFloatType(pBVar5,uVar11);
            }
            IStack_10ac = local_225c;
            if (bVar8) {
              IStack_10ac = spv::Builder::makeVectorType(_image_type_id,local_225c,size);
            }
            local_10b0 = 0;
            iVar3._0_1_ = access_meta[3].forced_composite;
            iVar3._1_1_ = access_meta[3].forced_struct;
            iVar3._2_2_ = *(undefined2 *)&access_meta[3].field_0xa;
            pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
            TVar12 = LLVMBC::Type::getTypeID(pTVar15);
            local_2271 = 1;
            if (TVar12 == IntegerTyID) {
              bVar9 = type_is_16bit(pTVar15);
              local_2272 = 0;
              if ((bVar9) &&
                 (local_2272 = 0,
                 ((ulong)instruction_local[0xc].super_Instruction.operands.
                         super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0)) {
                local_2272 = *(byte *)((long)&instruction_local[0x19].super_Instruction.operands.
                                              super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish + 2);
              }
              local_2271 = local_2272;
            }
            cb_1._7_1_ = local_2271 & 1;
            TVar12 = LLVMBC::Type::getTypeID(element_type_00);
            if (TVar12 == DoubleTyID) {
              cb_1._7_1_ = 0;
            }
            if ((iVar3 == 0xc) && (bVar7)) {
              p_Var17 = get_thread_log_callback();
              if (p_Var17 == (LoggingCallback)0x0) {
                fprintf(_stderr,"[ERROR]: Cannot use SSBOs and sparse feedback. >:(\n");
                fflush(_stderr);
              }
              else {
                snprintf((char *)&i_1,0x1000,"Cannot use SSBOs and sparse feedback. >:(\n");
                pvVar14 = get_thread_log_callback_userdata();
                (*p_Var17)(pvVar14,Error,(char *)&i_1);
              }
              return false;
            }
            if (iVar3 == 0xc) {
              chain_op._4_4_ =
                   spv::Builder::makePointer(_image_type_id,StorageClassStorageBuffer,IStack_10ac);
              chain_op._0_4_ = 0;
              while( true ) {
                if (bVar8) {
                  local_2288 = 1;
                }
                else {
                  local_2288 = i;
                }
                if (local_2288 <= (uint)chain_op) break;
                if ((bVar8) || ((local_40->access_mask & 1 << ((byte)(uint)chain_op & 0x1f)) != 0))
                {
                  load_op = Converter::Impl::allocate
                                      ((Impl *)instruction_local,OpAccessChain,chain_op._4_4_);
                  Operation::add_id(load_op,meta._4_4_);
                  pOVar18 = load_op;
                  IVar10 = spv::Builder::makeUintConstant(_image_type_id,0,false);
                  Operation::add_id(pOVar18,IVar10);
                  pOVar18 = load_op;
                  IVar10 = Converter::Impl::build_offset
                                     ((Impl *)instruction_local,raw_type,(uint)chain_op);
                  Operation::add_id(pOVar18,IVar10);
                  Converter::Impl::add((Impl *)instruction_local,load_op,false);
                  if ((access_meta[3].components & 0x100) != 0) {
                    spv::Builder::addDecoration(_image_type_id,load_op->id,DecorationNonUniform,-1);
                  }
                  _loaded_id_type =
                       Converter::Impl::allocate((Impl *)instruction_local,OpLoad,IStack_10ac);
                  Operation::add_id(_loaded_id_type,load_op->id);
                  Converter::Impl::add
                            ((Impl *)instruction_local,_loaded_id_type,
                             (bool)(*(byte *)((long)&access_meta[3].components + 3) & 1));
                  (&constructed_id)[(uint)chain_op] = _loaded_id_type->id;
                }
                else {
                  IVar10 = spv::Builder::createUndefined(_image_type_id,IStack_10ac);
                  (&constructed_id)[(uint)chain_op] = IVar10;
                }
                chain_op._0_4_ = (uint)chain_op + 1;
              }
              if (bVar8) {
                local_10b0 = constructed_id;
              }
              else {
                local_10b0 = Converter::Impl::build_vector
                                       ((Impl *)instruction_local,IStack_10ac,&constructed_id,i);
              }
            }
            else {
              sparse_code_id._3_1_ = spv::Builder::isStorageImageType(_image_type_id,(Id)meta);
              sparse_loaded_id_type = spv::Builder::makeVectorType(_image_type_id,IStack_10ac,4);
              pCVar6 = instruction_local;
              local_20fc = 0;
              local_2100 = 0;
              if (bVar7) {
                i_2 = IStack_10ac;
                local_2128 = &i_2;
                local_2120 = 2;
                __l_00._M_len = 2;
                __l_00._M_array = local_2128;
                IStack_212c = sparse_loaded_id_type;
                std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                          (&local_2118,__l_00,(allocator_type *)((long)&opcode + 3));
                local_2100 = Converter::Impl::get_struct_type
                                       ((Impl *)pCVar6,&local_2118,0,"SparseTexel");
                std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                          (&local_2118);
              }
              opcode._2_1_ = 1;
              for (local_2138 = 0; pBVar5 = _image_type_id, local_2138 < i;
                  local_2138 = local_2138 + 1) {
                if ((local_40->access_mask & 1 << ((byte)local_2138 & 0x1f)) == 0) {
                  IVar10 = spv::Builder::makeUintType(_image_type_id,0x20);
                  IVar10 = spv::Builder::createUndefined(pBVar5,IVar10);
                  (&constructed_id)[local_2138] = IVar10;
                }
                else {
                  if ((sparse_code_id._3_1_ & 1) == 0) {
                    local_22a2 = OpNop >> 0x10;
                    if (bVar7) {
                      local_22a2 = opcode._2_1_;
                    }
                    loaded_op._4_4_ = OpImageFetch;
                    if ((local_22a2 & 1) != OpNop >> 0x10) {
                      loaded_op._4_4_ = OpImageSparseFetch;
                    }
                  }
                  else {
                    local_22a1 = OpNop >> 0x10;
                    if (bVar7) {
                      local_22a1 = opcode._2_1_;
                    }
                    loaded_op._4_4_ = OpImageRead;
                    if ((local_22a1 & 1) != OpNop >> 0x10) {
                      loaded_op._4_4_ = OpImageSparseRead;
                    }
                  }
                  if ((bVar7) && ((opcode._2_1_ & 1) != OpNop >> 0x10)) {
                    local_22b4 = local_2100;
                  }
                  else {
                    local_22b4 = sparse_loaded_id_type;
                  }
                  pOVar18 = Converter::Impl::allocate
                                      ((Impl *)instruction_local,loaded_op._4_4_,local_22b4);
                  code_extract_op._0_4_ = meta._4_4_;
                  local_2148 = pOVar18;
                  code_extract_op._4_4_ =
                       Converter::Impl::build_offset((Impl *)instruction_local,raw_type,local_2138);
                  local_2158._M_array = (iterator)&code_extract_op;
                  local_2158._M_len = 2;
                  Operation::add_ids(pOVar18,&local_2158);
                  Converter::Impl::add
                            ((Impl *)instruction_local,local_2148,
                             (bool)(*(byte *)((long)&access_meta[3].components + 3) & 1));
                  if ((bVar7) && ((opcode._2_1_ & 1) != OpNop >> 0x10)) {
                    extracted_op = Converter::Impl::allocate
                                             ((Impl *)instruction_local,OpCompositeExtract,
                                              IStack_10ac);
                    Operation::add_id(extracted_op,local_2148->id);
                    Operation::add_literal(extracted_op,0);
                    Converter::Impl::add((Impl *)instruction_local,extracted_op,false);
                    local_20fc = extracted_op->id;
                    extracted_op_1 =
                         Converter::Impl::allocate
                                   ((Impl *)instruction_local,OpCompositeExtract,IStack_10ac);
                    Operation::add_id(extracted_op_1,local_2148->id);
                    Operation::add_literal(extracted_op_1,1);
                    Operation::add_literal(extracted_op_1,0);
                    Converter::Impl::add((Impl *)instruction_local,extracted_op_1,false);
                    (&constructed_id)[local_2138] = extracted_op_1->id;
                  }
                  else {
                    op = Converter::Impl::allocate
                                   ((Impl *)instruction_local,OpCompositeExtract,IStack_10ac);
                    Operation::add_id(op,local_2148->id);
                    Operation::add_literal(op,0);
                    Converter::Impl::add((Impl *)instruction_local,op,false);
                    (&constructed_id)[local_2138] = op->id;
                  }
                  opcode._2_1_ = OpNop >> 0x10;
                }
              }
              if (bVar7) {
                pOStack_2180 = Converter::Impl::allocate
                                         ((Impl *)instruction_local,OpCompositeConstruct,
                                          (Value *)builder);
                if (cb_1._7_1_ != 0) {
                  for (bitcast_op._4_4_ = 0; pCVar6 = instruction_local, bitcast_op._4_4_ < i;
                      bitcast_op._4_4_ = bitcast_op._4_4_ + 1) {
                    IVar10 = Converter::Impl::get_type_id((Impl *)instruction_local,pTVar15,0);
                    _i_5 = Converter::Impl::allocate((Impl *)pCVar6,OpBitcast,IVar10);
                    Operation::add_id(_i_5,(&constructed_id)[bitcast_op._4_4_]);
                    Converter::Impl::add((Impl *)instruction_local,_i_5,false);
                    (&constructed_id)[bitcast_op._4_4_] = _i_5->id;
                  }
                }
                for (casted_id = 0; casted_id < i; casted_id = casted_id + 1) {
                  Operation::add_id(pOStack_2180,(&constructed_id)[casted_id]);
                }
                for (local_2198 = i; pBVar5 = _image_type_id, pOVar18 = pOStack_2180, local_2198 < 4
                    ; local_2198 = local_2198 + 1) {
                  IVar10 = Converter::Impl::get_type_id((Impl *)instruction_local,pTVar15,0);
                  IVar10 = spv::Builder::createUndefined(pBVar5,IVar10);
                  Operation::add_id(pOVar18,IVar10);
                }
                Operation::add_id(pOStack_2180,local_20fc);
                Converter::Impl::add((Impl *)instruction_local,pOStack_2180,false);
              }
              else {
                local_10b0 = Converter::Impl::build_vector
                                       ((Impl *)instruction_local,IStack_10ac,&constructed_id,i);
              }
            }
            if (!bVar7) {
              if (cb_1._7_1_ == 0) {
                Converter::Impl::rewrite_value
                          ((Impl *)instruction_local,(Value *)builder,local_10b0);
              }
              else {
                bVar7 = type_is_16bit(pTVar15);
                pCVar6 = instruction_local;
                if (((bVar7) &&
                    (((ulong)instruction_local[0xc].super_Instruction.operands.
                             super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0)) &&
                   (((ulong)instruction_local[0x19].super_Instruction.operands.
                            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0x10000) != 0)) {
                  TVar12 = LLVMBC::Type::getTypeID(pTVar15);
                  pCVar6 = instruction_local;
                  if (TVar12 == HalfTyID) {
                    IVar10 = Converter::Impl::get_type_id((Impl *)instruction_local,F32,1,i,false);
                    narrow_op = Converter::Impl::allocate((Impl *)pCVar6,OpBitcast,IVar10);
                    Operation::add_id(narrow_op,local_10b0);
                    Converter::Impl::add((Impl *)instruction_local,narrow_op,false);
                    pCVar6 = instruction_local;
                    bitcast_op_1._4_4_ = narrow_op->id;
                    IVar10 = Converter::Impl::get_type_id((Impl *)instruction_local,F16,1,i,false);
                    narrow_op_1 = Converter::Impl::allocate((Impl *)pCVar6,OpFConvert,IVar10);
                    Operation::add_id(narrow_op_1,bitcast_op_1._4_4_);
                    Converter::Impl::add((Impl *)instruction_local,narrow_op_1,false);
                    bitcast_op_1._4_4_ = narrow_op_1->id;
                  }
                  else {
                    IVar10 = Converter::Impl::get_type_id((Impl *)instruction_local,U16,1,i,false);
                    op_1 = Converter::Impl::allocate((Impl *)pCVar6,OpUConvert,IVar10);
                    Operation::add_id(op_1,local_10b0);
                    Converter::Impl::add((Impl *)instruction_local,op_1,false);
                    bitcast_op_1._4_4_ = op_1->id;
                  }
                }
                else {
                  IVar10 = Converter::Impl::get_type_id((Impl *)instruction_local,pTVar15,0);
                  IVar10 = Converter::Impl::build_vector_type((Impl *)pCVar6,IVar10,i);
                  _texel_type = Converter::Impl::allocate((Impl *)pCVar6,OpBitcast,IVar10);
                  Operation::add_id(_texel_type,local_10b0);
                  Converter::Impl::add((Impl *)instruction_local,_texel_type,false);
                  bitcast_op_1._4_4_ = _texel_type->id;
                }
                Converter::Impl::rewrite_value
                          ((Impl *)instruction_local,(Value *)builder,bitcast_op_1._4_4_);
              }
              build_exploded_composite_from_vector
                        ((Impl *)instruction_local,(Instruction *)builder,i);
            }
            local_40->forced_composite = false;
          }
          impl_local._7_1_ = true;
        }
      }
    }
    else {
      impl_local._7_1_ = true;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.ags.num_instructions == 1)
	{
		if (instruction->getOperand(2) == impl.ags.backdoor_instructions[0])
		{
			impl.ags.active_uav_ptr = impl.get_id_for_value(instruction->getOperand(1));
			impl.ags.active_uav_op = DXIL::Op::BufferLoad;
			impl.ags.active_read_backdoor = instruction;
			return true;
		}
	}

	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;

	// Leave no gaps in the access mask to aid vectorization.
	// For reads, we can safely read components we not strictly need to read.
	uint32_t smeared_access_mask;

	if (meta.storage != spv::StorageClassUniformConstant)
	{
		smeared_access_mask = access_meta.access_mask & 0xfu;
		smeared_access_mask |= smeared_access_mask >> 1u;
		smeared_access_mask |= smeared_access_mask >> 2u;
	}
	else
		smeared_access_mask = 1;

	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (sparse)
		{
			LOGE("Cannot use BDA and sparse feedback. >:(\n");
			return false;
		}

		// We don't know more about alignment in SM 5.1 BufferStore.
		// We know the type must be 32-bit however ...
		// Might be possible to do some fancy analysis to deduce a better alignment.

		return emit_physical_buffer_load_instruction(impl, instruction, meta.physical_pointer_meta,
		                                             smeared_access_mask, 4);
	}

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	bool raw_access_chain = buffer_access_is_raw_access_chain(impl, meta) && !sparse;
	if (raw_access_chain)
		return emit_buffer_load_raw_chain_instruction(impl, instruction, meta, access_meta);

	auto *result_type = instruction->getType();
	auto *target_type = result_type->getStructElementType(0);

	bool is_typed = meta.kind == DXIL::ResourceKind::TypedBuffer;
	auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id,
	                                  result_type->getStructElementType(0),
	                                  smeared_access_mask);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, target_type);
	RawType raw_type = target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID ?
	                   RawType::Float : RawType::Integer;

	image_id = get_buffer_alias_handle(impl, meta, image_id, raw_type, width, access.raw_vec_size);
	bool vectorized_load = access.raw_vec_size != RawVecSize::V1;

	// Sparse information is stored in the 5th component.
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (!is_typed)
	{
		// Unroll up to 4 loads. Ideally, we'd probably use physical_storage_buffer here, but unfortunately we have no indication
		// how many components we need to load here, and the number of components we load is not necessarily constant,
		// so we cannot reliably encode this information in the SRV.
		// The best we can do is to infer it from stride if we can.
		//unsigned conservative_num_elements = std::min(access.num_components, std::min(4u, access_meta.components));
		unsigned conservative_num_elements = 0;
		unsigned vecsize = raw_vecsize_to_vecsize(access.raw_vec_size);

		if (vectorized_load)
			conservative_num_elements = vecsize;
		else
		{
			for (unsigned i = 0; i < 4; i++)
				if ((access_meta.access_mask & (1u << i)) != 0)
					conservative_num_elements = i + 1;
		}

		spv::Id component_ids[4] = {};

		spv::Id extracted_id_type = raw_type == RawType::Integer ?
		                            builder.makeUintType(raw_width_to_bits(width)) :
		                            builder.makeFloatType(raw_width_to_bits(width));

		if (vectorized_load)
			extracted_id_type = builder.makeVectorType(extracted_id_type, vecsize);

		spv::Id constructed_id = 0;
		bool ssbo = meta.storage == spv::StorageClassStorageBuffer;

		auto *element_type = result_type->getStructElementType(0);
		bool need_cast = (element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID) ||
		                 (type_is_16bit(element_type) && !impl.execution_mode_meta.native_16bit_operations &&
		                  impl.options.min_precision_prefer_native_16bit);

		// FP64 is handled directly.
		if (target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID)
			need_cast = false;

		if (ssbo && sparse)
		{
			LOGE("Cannot use SSBOs and sparse feedback. >:(\n");
			return false;
		}

		if (ssbo)
		{
			spv::Id ptr_type = builder.makePointer(spv::StorageClassStorageBuffer, extracted_id_type);
			for (unsigned i = 0; i < (vectorized_load ? 1 : conservative_num_elements); i++)
			{
				if (vectorized_load || (access_meta.access_mask & (1u << i)) != 0)
				{
					auto *chain_op = impl.allocate(spv::OpAccessChain, ptr_type);
					chain_op->add_id(image_id);
					chain_op->add_id(builder.makeUintConstant(0));
					chain_op->add_id(impl.build_offset(access.index_id, i));
					impl.add(chain_op);

					if (meta.non_uniform)
						builder.addDecoration(chain_op->id, spv::DecorationNonUniform);

					auto *load_op = impl.allocate(spv::OpLoad, extracted_id_type);
					load_op->add_id(chain_op->id);
					impl.add(load_op, meta.rov);
					component_ids[i] = load_op->id;
				}
				else
					component_ids[i] = builder.createUndefined(extracted_id_type);
			}

			if (vectorized_load)
				constructed_id = component_ids[0];
			else
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
		}
		else
		{
			bool is_uav = builder.isStorageImageType(image_type_id);

			spv::Id loaded_id_type = builder.makeVectorType(extracted_id_type, 4);
			spv::Id sparse_code_id = 0;
			spv::Id sparse_loaded_id_type = 0;
			if (sparse)
				sparse_loaded_id_type = impl.get_struct_type({ extracted_id_type, loaded_id_type }, 0, "SparseTexel");

			bool first_load = true;
			for (unsigned i = 0; i < conservative_num_elements; i++)
			{
				if (access_meta.access_mask & (1u << i))
				{
					// There is no sane way to combine sparse feedback code, since it's completely opaque to application.
					// We could hypothetically return a vector of status code and deal with it magically, but let's not go there ...
					spv::Op opcode;
					if (is_uav)
						opcode = (sparse && first_load) ? spv::OpImageSparseRead : spv::OpImageRead;
					else
						opcode = (sparse && first_load) ? spv::OpImageSparseFetch : spv::OpImageFetch;

					Operation *loaded_op =
					    impl.allocate(opcode, (sparse && first_load) ? sparse_loaded_id_type : loaded_id_type);
					loaded_op->add_ids({ image_id, impl.build_offset(access.index_id, i) });
					impl.add(loaded_op, meta.rov);

					if (sparse && first_load)
					{
						auto *code_extract_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						code_extract_op->add_id(loaded_op->id);
						code_extract_op->add_literal(0);
						impl.add(code_extract_op);
						sparse_code_id = code_extract_op->id;

						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(1);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					else
					{
						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					first_load = false;
				}
				else
					component_ids[i] = builder.createUndefined(builder.makeUintType(32));
			}

			if (sparse)
			{
				Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction);

				if (need_cast)
				{
					for (unsigned i = 0; i < conservative_num_elements; i++)
					{
						auto *bitcast_op =
						    impl.allocate(spv::OpBitcast, impl.get_type_id(element_type));
						bitcast_op->add_id(component_ids[i]);
						impl.add(bitcast_op);
						component_ids[i] = bitcast_op->id;
					}
				}

				for (unsigned i = 0; i < conservative_num_elements; i++)
					op->add_id(component_ids[i]);
				for (unsigned i = conservative_num_elements; i < 4; i++)
					op->add_id(builder.createUndefined(impl.get_type_id(element_type)));
				op->add_id(sparse_code_id);
				impl.add(op);
			}
			else
			{
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
			}
		}

		if (!sparse)
		{
			if (need_cast)
			{
				spv::Id casted_id;

				if (type_is_16bit(element_type) &&
				    !impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit)
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *bitcast_op = impl.allocate(
							spv::OpBitcast,
							impl.get_type_id(DXIL::ComponentType::F32, 1, conservative_num_elements));
						bitcast_op->add_id(constructed_id);
						impl.add(bitcast_op);
						casted_id = bitcast_op->id;

						Operation *narrow_op = impl.allocate(
							spv::OpFConvert,
							impl.get_type_id(DXIL::ComponentType::F16, 1, conservative_num_elements));
						narrow_op->add_id(casted_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
					else
					{
						Operation *narrow_op = impl.allocate(
							spv::OpUConvert,
							impl.get_type_id(DXIL::ComponentType::U16, 1, conservative_num_elements));
						narrow_op->add_id(constructed_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
				}
				else
				{
					Operation *op = impl.allocate(
						spv::OpBitcast, impl.build_vector_type(impl.get_type_id(element_type), conservative_num_elements));
					op->add_id(constructed_id);
					impl.add(op);
					casted_id = op->id;
				}

				impl.rewrite_value(instruction, casted_id);
			}
			else
				impl.rewrite_value(instruction, constructed_id);

			build_exploded_composite_from_vector(impl, instruction, conservative_num_elements);
		}

		access_meta.forced_composite = false;
	}
	else
	{
		bool is_uav = builder.isStorageImageType(image_type_id);

		auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
		spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
		spv::Id sample_type;

		if (sparse)
			sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
		else
			sample_type = texel_type;

		spv::Op opcode;
		if (is_uav)
			opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
		else
			opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

		Operation *op = impl.allocate(opcode, instruction, sample_type);

		if (!sparse)
			impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

		op->add_ids({ image_id, access.index_id });
		impl.add(op, meta.rov);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}